

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledPipelineDesc.cpp
# Opt level: O2

int __thiscall
PolledPipelineDesc::poll(PolledPipelineDesc *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  uint *puVar1;
  pointer puVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  Pipeline *this_00;
  Pipeline *pPVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined4 in_register_0000000c;
  char *pcVar7;
  string_view s;
  Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  
  pcVar7 = (char *)CONCAT44(in_register_0000000c,__timeout);
  if ((this->super_PolledResource).poll_seq_ != (uint)__fds) {
    (this->super_PolledResource).poll_seq_ = (uint)__fds;
    iVar3 = PolledFile::poll((this->file_).
                             super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fds
                             ,__nfds,__timeout);
    if ((char)iVar3 != '\0') {
      pvVar4 = PolledFile::data((this->file_).
                                super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar4 = PolledFile::data((this->file_).
                                super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      s._M_str = pcVar7;
      s._M_len = (size_t)puVar2;
      renderdesc::Pipeline::load_abi_cxx11_
                (&result,(Pipeline *)
                         ((pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish +
                         -(long)(pvVar4->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start),s);
      if (result.has_value_ == false) {
        pbVar6 = Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error(&result);
        aAppDebugPrintf("Error parsing pipeline desc: %s",(pbVar6->_M_dataplus)._M_p);
      }
      else {
        this_00 = (Pipeline *)operator_new(0x78);
        pPVar5 = Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&result);
        renderdesc::Pipeline::Pipeline(this_00,pPVar5);
        std::__shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>::
        reset<renderdesc::Pipeline>
                  (&(this->pipeline_).
                    super___shared_ptr<renderdesc::Pipeline,_(__gnu_cxx::_Lock_policy)2>,this_00);
        puVar1 = &(this->super_PolledResource).resource_version_;
        *puVar1 = *puVar1 + 1;
      }
      Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&result);
      return (int)CONCAT71((int7)((ulong)puVar2 >> 8),result.has_value_);
    }
  }
  return 0;
}

Assistant:

PolledPipelineDesc::~PolledPipelineDesc()
{
}